

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

int phr_parse_request(char *buf_start,size_t len,char **method,size_t *method_len,char **path,
                     size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  byte bVar8;
  int r;
  size_t local_40;
  size_t *local_38;
  
  local_40 = *num_headers;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  pcVar6 = buf_start + len;
  *minor_version = -1;
  *num_headers = 0;
  local_38 = method_len;
  if ((last_len != 0) && (pcVar3 = is_complete(buf_start,pcVar6,last_len,&r), pcVar3 == (char *)0x0)
     ) {
    return r;
  }
  if (len != 0) {
    if (*buf_start == '\n') {
      pcVar3 = buf_start + 1;
    }
    else {
      pcVar3 = buf_start;
      if (*buf_start == '\r') {
        if (len == 1) {
          return -2;
        }
        if (buf_start[1] != '\n') {
          return -1;
        }
        pcVar3 = buf_start + 2;
      }
    }
    if (pcVar3 != pcVar6) {
      sVar4 = 0;
      while (bVar8 = pcVar3[sVar4], bVar8 != 0x20) {
        if (bVar8 - 0x7f < 0xffffffa1) {
          if (bVar8 < 0x20) {
            return -1;
          }
          if (bVar8 == 0x7f) {
            return -1;
          }
        }
        lVar7 = sVar4 + 1;
        sVar4 = sVar4 + 1;
        if (pcVar3 + lVar7 == pcVar6) {
          return -2;
        }
      }
      *method = pcVar3;
      *local_38 = sVar4;
      pcVar3 = pcVar3 + sVar4;
      do {
        bVar8 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while (bVar8 == 0x20);
      if (pcVar3 == pcVar6) {
        return -2;
      }
      lVar7 = 1;
      lVar5 = 0;
      while (bVar8 != 0x20) {
        if (bVar8 - 0x7f < 0xffffffa1) {
          if (bVar8 < 0x20) {
            return -1;
          }
          if (bVar8 == 0x7f) {
            return -1;
          }
        }
        if (pcVar3 + (1 - lVar5) == pcVar6) {
          return -2;
        }
        pbVar2 = (byte *)(pcVar3 + lVar7);
        lVar5 = lVar5 + -1;
        lVar7 = lVar7 + 1;
        bVar8 = *pbVar2;
      }
      *path = pcVar3;
      pcVar3 = pcVar3 + -lVar5;
      *path_len = -lVar5;
      do {
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
      } while (*pcVar1 == ' ');
      if ((lVar5 != 0) && (*local_38 != 0)) {
        pcVar3 = parse_http_version(pcVar3,pcVar6,minor_version,&r);
        if (pcVar3 == (char *)0x0) {
          return r;
        }
        if (*pcVar3 == '\n') {
          pcVar3 = pcVar3 + 1;
LAB_00118ef8:
          pcVar6 = parse_headers(pcVar3,pcVar6,headers,num_headers,local_40,&r);
          if (pcVar6 != (char *)0x0) {
            return (int)pcVar6 - (int)buf_start;
          }
          return r;
        }
        if (*pcVar3 == '\r') {
          if (pcVar3 + 1 == pcVar6) {
            return -2;
          }
          if (pcVar3[1] == '\n') {
            pcVar3 = pcVar3 + 2;
            goto LAB_00118ef8;
          }
        }
      }
      return -1;
    }
  }
  return -2;
}

Assistant:

int phr_parse_request(const char *buf_start, size_t len, const char **method,
					  size_t *method_len, const char **path, size_t *path_len,
					  int *minor_version, struct phr_header *headers,
					  size_t *num_headers, size_t last_len)
{
	const char *buf = buf_start, *buf_end = buf_start + len;
	size_t max_headers = *num_headers;
	int r;

	*method = NULL;
	*method_len = 0;
	*path = NULL;
	*path_len = 0;
	*minor_version = -1;
	*num_headers = 0;

	/* if last_len != 0, check if the request is complete (a fast countermeasure
	   againt slowloris */
	if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
		return r;
	}

	if ((buf = parse_request(buf, buf_end, method, method_len, path, path_len,
							 minor_version, headers, num_headers, max_headers,
							 &r)) == NULL) {
		return r;
	}

	return (int)(buf - buf_start);
}